

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void VP8LBitReaderSetBuffer(VP8LBitReader *br,uint8_t *buf,size_t len)

{
  int iVar1;
  size_t in_RDX;
  uint8_t *in_RSI;
  VP8LBitReader *in_RDI;
  bool local_19;
  
  in_RDI->buf = in_RSI;
  in_RDI->len = in_RDX;
  local_19 = true;
  if (in_RDI->pos <= in_RDI->len) {
    iVar1 = VP8LIsEndOfStream(in_RDI);
    local_19 = iVar1 != 0;
  }
  in_RDI->eos = (uint)local_19;
  return;
}

Assistant:

void VP8LBitReaderSetBuffer(VP8LBitReader* const br,
                            const uint8_t* const buf, size_t len) {
  assert(br != NULL);
  assert(buf != NULL);
  assert(len < 0xfffffff8u);   // can't happen with a RIFF chunk.
  br->buf = buf;
  br->len = len;
  // 'pos' > 'len' should be considered a param error.
  br->eos = (br->pos > br->len) || VP8LIsEndOfStream(br);
}